

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::EmitGlobalBody(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  ParseNode *stmt_00;
  bool bVar1;
  ParseNodeProg *pPVar2;
  ParseNodeBin *pPVar3;
  ParseNode *stmt;
  ParseNode *pnodeLastVal;
  ParseNode *pnode;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  pnodeLastVal = funcInfo->root->pnodeBody;
  pPVar2 = ParseNode::AsParseNodeProg(&funcInfo->root->super_ParseNode);
  stmt = pPVar2->pnodeLastValStmt;
  if ((stmt == (ParseNode *)0x0) || (bVar1 = ParseNode::IsPatternDeclaration(stmt), bVar1)) {
    Js::ByteCodeWriter::Reg1(&this->m_writer,LdUndef,0xfffffffe);
  }
  while (pnodeLastVal->nop == knopList) {
    pPVar3 = ParseNode::AsParseNodeBin(pnodeLastVal);
    stmt_00 = pPVar3->pnode1;
    if (stmt_00 == stmt) {
      stmt = (ParseNode *)0x0;
    }
    if ((stmt == (ParseNode *)0x0) && ((this->flags & 2) != 0)) {
      EmitTopLevelStatement(this,stmt_00,funcInfo,1);
    }
    else {
      EmitTopLevelStatement(this,stmt_00,funcInfo,0);
    }
    pPVar3 = ParseNode::AsParseNodeBin(pnodeLastVal);
    pnodeLastVal = pPVar3->pnode2;
  }
  EmitTopLevelStatement(this,pnodeLastVal,funcInfo,0);
  return;
}

Assistant:

void ByteCodeGenerator::EmitGlobalBody(FuncInfo *funcInfo)
{
    // Emit global code (global scope or eval), fixing up the return register with the implicit
    // return value.
    ParseNode *pnode = funcInfo->root->pnodeBody;
    ParseNode *pnodeLastVal = funcInfo->root->AsParseNodeProg()->pnodeLastValStmt;
    if (pnodeLastVal == nullptr || pnodeLastVal->IsPatternDeclaration())
    {
        // We're not guaranteed to compute any values, so fix up the return register at the top
        // in case.
        this->m_writer.Reg1(Js::OpCode::LdUndef, ReturnRegister);
    }

    while (pnode->nop == knopList)
    {
        ParseNode *stmt = pnode->AsParseNodeBin()->pnode1;
        if (stmt == pnodeLastVal)
        {
            pnodeLastVal = nullptr;
        }
        if (pnodeLastVal == nullptr && (this->flags & fscrReturnExpression))
        {
            EmitTopLevelStatement(stmt, funcInfo, true);
        }
        else
        {
            // Haven't hit the post-dominating return value yet,
            // so don't bother with the return register.
            EmitTopLevelStatement(stmt, funcInfo, false);
        }
        pnode = pnode->AsParseNodeBin()->pnode2;
    }
    EmitTopLevelStatement(pnode, funcInfo, false);
}